

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetSourceFilePaths
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  pointer *ppEVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  pointer pcVar3;
  cmGeneratorTarget *pcVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pointer pbVar7;
  bool *pbVar8;
  bool bVar9;
  bool bVar12;
  int iVar13;
  bool bVar10;
  bool bVar11;
  TargetType TVar14;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var15;
  cmLinkImplementationLibraries *pcVar16;
  long *plVar17;
  string *psVar18;
  cmFileSet *pcVar19;
  Tribool TVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer pEVar21;
  size_type *psVar22;
  string *item;
  cmGeneratorTarget *__args;
  pointer pcVar23;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar24;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  string *psVar26;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  cmBTStringRange cVar27;
  cmBTStringRange cVar28;
  cmBTStringRange cVar29;
  cmBTStringRange cVar30;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view arg_03;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2a0;
  size_type __dnew_1;
  string *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  EvaluatedTargetPropertyEntries fileSetEntries;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_240;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string local_228;
  string genex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  EvaluatedTargetPropertyEntries linkObjectsEntries;
  cmListFileBacktrace local_1a8;
  EvaluatedTargetPropertyEntries linkInterfaceSourcesEntries;
  long *local_170 [2];
  long local_160 [2];
  ulong local_150;
  ulong local_148;
  ulong local_140;
  cmGeneratorExpression ge;
  EvaluatedTargetPropertyEntries entries;
  string local_108;
  cmGeneratorExpressionDAGChecker dagChecker;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueSrcs;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
    cVar27 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
    if (cVar27.Begin._M_current._M_current != cVar27.End._M_current._M_current) {
      do {
        local_2a0 = cVar27.End._M_current;
        _Var25 = cVar27.Begin._M_current;
        arg._M_str = ((_Var25._M_current)->Value)._M_dataplus._M_p;
        arg._M_len = ((_Var25._M_current)->Value)._M_string_length;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&dagChecker,arg,false);
        pcVar4 = dagChecker.Target;
        for (__args = (cmGeneratorTarget *)dagChecker.Parent; __args != pcVar4;
            __args = (cmGeneratorTarget *)&__args->ObjectDirectory) {
          pcVar2 = ((_Alloc_hider *)&__args->Target)->_M_p;
          fileSetEntries.Entries.
          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)__args->Makefile;
          fileSetEntries.Entries.
          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = SUB81(pcVar2,0);
          fileSetEntries.Entries.
          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = (undefined7)((ulong)pcVar2 >> 8);
          __str._M_str = "$<TARGET_OBJECTS:";
          __str._M_len = 0x11;
          iVar13 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             ((basic_string_view<char,_std::char_traits<char>_> *)&fileSetEntries,0,
                              0x11,__str);
          if ((iVar13 != 0) ||
             ((((_Alloc_hider *)&__args->Target)->_M_p + -1)[(long)__args->Makefile] != '>')) {
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       __return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dagChecker);
        cVar27.End._M_current = local_2a0._M_current;
        cVar27.Begin._M_current = _Var25._M_current + 1;
      } while (_Var25._M_current + 1 != local_2a0._M_current);
    }
  }
  else {
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = this->Makefile;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1d;
    dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)&dagChecker.Property;
    dagChecker.Parent =
         (cmGeneratorExpressionDAGChecker *)
         std::__cxx11::string::_M_create((ulong *)&dagChecker,(ulong)&fileSetEntries);
    dagChecker.Property._M_dataplus._M_p =
         (pointer)fileSetEntries.Entries.
                  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    builtin_strncpy((char *)((long)&(dagChecker.Parent)->Target + 5),"ARGET_PR",8);
    builtin_strncpy((char *)((long)&((dagChecker.Parent)->Property)._M_dataplus._M_p + 5),"OPERTIES"
                    ,8);
    (dagChecker.Parent)->Parent = (cmGeneratorExpressionDAGChecker *)0x45445f454b414d43;
    (dagChecker.Parent)->Target = (cmGeneratorTarget *)0x475241545f475542;
    dagChecker.Target =
         (cmGeneratorTarget *)
         fileSetEntries.Entries.
         super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(undefined1 *)
     ((long)&(fileSetEntries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_start)->LinkImplItem +
     (long)&(dagChecker.Parent)->Parent) = 0;
    cmMakefile::GetDefExpandList(this_00,(string *)&dagChecker,&debugProperties,false);
    if (dagChecker.Parent != (cmGeneratorExpressionDAGChecker *)&dagChecker.Property) {
      operator_delete(dagChecker.Parent,(ulong)(dagChecker.Property._M_dataplus._M_p + 1));
    }
    if (this->DebugSourcesDone == false) {
      _Var15 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                         (debugProperties.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          debugProperties.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,"SOURCES");
      bVar12 = _Var15._M_current !=
               debugProperties.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar12 = false;
    }
    if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
      this->DebugSourcesDone = true;
    }
    local_108.field_2._M_allocated_capacity._0_4_ = 0x52554f53;
    local_108._M_string_length = 7;
    local_108.field_2._M_allocated_capacity._4_4_ = 0x534543;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,this,&local_108,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT44(local_108.field_2._M_allocated_capacity._4_4_,
                               local_108.field_2._M_allocated_capacity._0_4_) + 1);
    }
    ppEVar1 = &fileSetEntries.Entries.
               super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppEVar1;
    anon_unknown.dwarf_1dbda9e::EvaluateTargetPropertyEntries
              (&entries,this,config,(string *)&fileSetEntries,&dagChecker,&this->SourceEntries);
    if (fileSetEntries.Entries.
        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppEVar1) {
      operator_delete(fileSetEntries.Entries.
                      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      CONCAT71(fileSetEntries.Entries.
                               super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               fileSetEntries.Entries.
                               super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
    }
    uniqueSrcs._M_h._M_buckets = &uniqueSrcs._M_h._M_single_bucket;
    uniqueSrcs._M_h._M_bucket_count = 1;
    uniqueSrcs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uniqueSrcs._M_h._M_element_count = 0;
    uniqueSrcs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    uniqueSrcs._M_h._M_rehash_policy._M_next_resize = 0;
    uniqueSrcs._M_h._M_single_bucket = (__node_base_ptr)0x0;
    bVar9 = anon_unknown.dwarf_1dbda9e::processSources
                      (this,&entries,__return_storage_ptr__,&uniqueSrcs,bVar12);
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    linkInterfaceSourcesEntries.HadContextSensitiveCondition = false;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    __dnew_1 = 0x11;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppEVar1;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)std::__cxx11::string::_M_create((ulong *)&fileSetEntries,(ulong)&__dnew_1);
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = (undefined1)__dnew_1;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = (undefined7)(__dnew_1 >> 8);
    (fileSetEntries.Entries.
     super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
     ._M_impl.super__Vector_impl_data._M_start)->LinkImplItem = (cmLinkImplItem *)0x4341465245544e49
    ;
    ((fileSetEntries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start)->Backtrace).
    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x454352554f535f45;
    *(undefined1 *)
     &((fileSetEntries.Entries.
        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start)->Backtrace).
      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = 0x53;
    *(undefined1 *)
     ((long)&(fileSetEntries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_start)->LinkImplItem + __dnew_1) = 0;
    local_290 = (string *)0x0;
    local_288._M_local_buf[0] = '\0';
    __dnew_1 = (size_type)&local_288;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ =
         fileSetEntries.Entries.
         super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
         fileSetEntries.Entries.
         super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_;
    anon_unknown.dwarf_1dbda9e::AddInterfaceEntries
              (this,config,(string *)&fileSetEntries,(string *)&__dnew_1,&dagChecker,
               &linkInterfaceSourcesEntries,No,Usage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew_1 != &local_288) {
      operator_delete((void *)__dnew_1,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (fileSetEntries.Entries.
        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppEVar1) {
      operator_delete(fileSetEntries.Entries.
                      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      CONCAT71(fileSetEntries.Entries.
                               super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               fileSetEntries.Entries.
                               super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
    }
    local_140 = (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    bVar10 = anon_unknown.dwarf_1dbda9e::processSources
                       (this,&linkInterfaceSourcesEntries,__return_storage_ptr__,&uniqueSrcs,bVar12)
    ;
    local_148 = (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    TVar14 = cmTarget::GetType(this->Target);
    if (TVar14 == OBJECT_LIBRARY) {
      bVar11 = false;
    }
    else {
      linkObjectsEntries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      linkObjectsEntries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      linkObjectsEntries.HadContextSensitiveCondition = false;
      linkObjectsEntries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      linkObjectsEntries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      linkObjectsEntries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      pcVar16 = GetLinkImplementationLibrariesInternal(this,config,this,Usage);
      if (pcVar16 != (cmLinkImplementationLibraries *)0x0) {
        linkObjectsEntries.HadContextSensitiveCondition = pcVar16->HadContextSensitiveCondition;
        pcVar23 = (pcVar16->Libraries).
                  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pcVar3 = (pcVar16->Libraries).
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pcVar23 != pcVar3) {
          do {
            pcVar4 = (pcVar23->super_cmLinkItem).Target;
            if ((pcVar4 != (cmGeneratorTarget *)0x0) &&
               (TVar14 = cmTarget::GetType(pcVar4->Target), TVar14 == OBJECT_LIBRARY)) {
              cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
                        ((string *)&__dnew_1,this->LocalGenerator->GlobalGenerator,
                         (pcVar23->super_cmLinkItem).Target);
              plVar17 = (long *)std::__cxx11::string::replace
                                          ((ulong)&__dnew_1,0,(char *)0x0,0x761f7c);
              fileSetEntries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&fileSetEntries.Entries.
                             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pEVar21 = (pointer)(plVar17 + 2);
              if ((pointer)*plVar17 == pEVar21) {
                fileSetEntries.Entries.
                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
                     SUB81(pEVar21->LinkImplItem,0);
                fileSetEntries.Entries.
                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ =
                     (undefined7)((ulong)pEVar21->LinkImplItem >> 8);
                fileSetEntries.HadContextSensitiveCondition = SUB81(plVar17[3],0);
                fileSetEntries._25_7_ = SUB87((ulong)plVar17[3] >> 8,0);
              }
              else {
                fileSetEntries.Entries.
                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
                     SUB81(pEVar21->LinkImplItem,0);
                fileSetEntries.Entries.
                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ =
                     (undefined7)((ulong)pEVar21->LinkImplItem >> 8);
                fileSetEntries.Entries.
                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar17;
              }
              fileSetEntries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = (undefined1)plVar17[1];
              fileSetEntries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
                   (undefined7)((ulong)plVar17[1] >> 8);
              *plVar17 = (long)pEVar21;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              plVar17 = (long *)std::__cxx11::string::append((char *)&fileSetEntries);
              psVar22 = (size_type *)(plVar17 + 2);
              if ((size_type *)*plVar17 == psVar22) {
                genex.field_2._M_allocated_capacity = *psVar22;
                genex.field_2._8_8_ = plVar17[3];
                genex._M_dataplus._M_p = (pointer)&genex.field_2;
              }
              else {
                genex.field_2._M_allocated_capacity = *psVar22;
                genex._M_dataplus._M_p = (pointer)*plVar17;
              }
              genex._M_string_length = plVar17[1];
              *plVar17 = (long)psVar22;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              if (fileSetEntries.Entries.
                  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&fileSetEntries.Entries.
                            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(fileSetEntries.Entries.
                                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                CONCAT71(fileSetEntries.Entries.
                                         super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                         fileSetEntries.Entries.
                                         super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) +
                                1);
              }
              local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (pcVar23->super_cmLinkItem).Backtrace.
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (pcVar23->super_cmLinkItem).Backtrace.
                   super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
              if (local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                        TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                        TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              cmGeneratorExpression::cmGeneratorExpression(&ge,&local_1a8);
              if (local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                           TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              local_170[0] = local_160;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_170,genex._M_dataplus._M_p,
                         genex._M_dataplus._M_p + genex._M_string_length);
              cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
              if (local_170[0] != local_160) {
                operator_delete(local_170[0],local_160[0] + 1);
              }
              *(undefined1 *)
               ((long)cge._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
               0x49) = 1;
              peVar5 = (pcVar23->super_cmLinkItem).Backtrace.
                       super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              p_Var6 = (pcVar23->super_cmLinkItem).Backtrace.
                       super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                }
              }
              fileSetEntries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = SUB81(peVar5,0);
              fileSetEntries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ = (undefined7)((ulong)peVar5 >> 8);
              fileSetEntries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = SUB81(p_Var6,0);
              fileSetEntries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ =
                   (undefined7)((ulong)p_Var6 >> 8);
              fileSetEntries.HadContextSensitiveCondition = false;
              fileSetEntries._25_7_ = 0;
              local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
              local_228._M_string_length = 0;
              local_228.field_2._M_local_buf[0] = '\0';
              fileSetEntries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar23;
              psVar18 = cmCompiledGeneratorExpression::Evaluate
                                  ((cmCompiledGeneratorExpression *)
                                   cge._M_t.
                                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                   _M_head_impl,this->LocalGenerator,config,this,&dagChecker,
                                   (cmGeneratorTarget *)0x0,&local_228);
              arg_03._M_str = (psVar18->_M_dataplus)._M_p;
              arg_03._M_len = psVar18->_M_string_length;
              cmExpandList(arg_03,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&fileSetEntries.HadContextSensitiveCondition,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._M_dataplus._M_p != &local_228.field_2) {
                operator_delete(local_228._M_dataplus._M_p,
                                CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                         local_228.field_2._M_local_buf[0]) + 1);
              }
              std::
              vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                        (&linkObjectsEntries.Entries,(EvaluatedTargetPropertyEntry *)&fileSetEntries
                        );
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&fileSetEntries.HadContextSensitiveCondition);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT71(fileSetEntries.Entries.
                           super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                           fileSetEntries.Entries.
                           super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT71(fileSetEntries.Entries.
                                    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                    fileSetEntries.Entries.
                                    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_));
              }
              std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::~unique_ptr(&cge);
              cmGeneratorExpression::~cmGeneratorExpression(&ge);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)genex._M_dataplus._M_p != &genex.field_2) {
                operator_delete(genex._M_dataplus._M_p,genex.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__dnew_1 != &local_288) {
                operator_delete((void *)__dnew_1,
                                CONCAT71(local_288._M_allocated_capacity._1_7_,
                                         local_288._M_local_buf[0]) + 1);
              }
            }
            pcVar23 = pcVar23 + 1;
          } while (pcVar23 != pcVar3);
        }
      }
      bVar11 = anon_unknown.dwarf_1dbda9e::processSources
                         (this,&linkObjectsEntries,__return_storage_ptr__,&uniqueSrcs,bVar12);
      pEVar21 = (pointer)CONCAT71(linkObjectsEntries.Entries.
                                  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                  linkObjectsEntries.Entries.
                                  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._0_1_);
      if (linkObjectsEntries.Entries.
          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ._M_impl.super__Vector_impl_data._M_start != pEVar21) {
        pvVar24 = &(linkObjectsEntries.Entries.
                    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start)->Values;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(pvVar24);
          pbVar7 = (pointer)(((EvaluatedTargetPropertyEntry *)(pvVar24 + -1))->Backtrace).
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
          if (pbVar7 != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar7);
          }
          pbVar8 = (bool *)(pvVar24 + 1);
          pvVar24 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&pvVar24[2].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
        } while ((pointer)(pbVar8 + 8) != pEVar21);
      }
      if (linkObjectsEntries.Entries.
          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(linkObjectsEntries.Entries.
                        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT71(linkObjectsEntries.Entries.
                                 super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 linkObjectsEntries.Entries.
                                 super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                        (long)linkObjectsEntries.Entries.
                              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_150 = (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    fileSetEntries.HadContextSensitiveCondition = false;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    cVar28 = cmTarget::GetHeaderSetsEntries_abi_cxx11_(this->Target);
    if (cVar28.Begin._M_current._M_current != cVar28.End._M_current._M_current) {
      do {
        local_240 = cVar28.End._M_current;
        _Var25 = cVar28.Begin._M_current;
        arg_00._M_str = ((_Var25._M_current)->Value)._M_dataplus._M_p;
        arg_00._M_len = ((_Var25._M_current)->Value)._M_string_length;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__dnew_1,arg_00,false);
        psVar18 = local_290;
        for (psVar26 = (string *)__dnew_1; psVar26 != psVar18; psVar26 = psVar26 + 1) {
          pcVar19 = cmTarget::GetFileSet(this->Target,psVar26);
          anon_unknown.dwarf_1dbda9e::addFileSetEntry
                    (this,config,&dagChecker,pcVar19,&fileSetEntries);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__dnew_1);
        cVar28.End._M_current = local_240._M_current;
        cVar28.Begin._M_current = _Var25._M_current + 1;
      } while (_Var25._M_current + 1 != local_240._M_current);
    }
    cVar29 = cmTarget::GetCxxModuleSetsEntries_abi_cxx11_(this->Target);
    if (cVar29.Begin._M_current._M_current != cVar29.End._M_current._M_current) {
      do {
        local_240 = cVar29.End._M_current;
        _Var25 = cVar29.Begin._M_current;
        arg_01._M_str = ((_Var25._M_current)->Value)._M_dataplus._M_p;
        arg_01._M_len = ((_Var25._M_current)->Value)._M_string_length;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__dnew_1,arg_01,false);
        psVar18 = local_290;
        for (psVar26 = (string *)__dnew_1; psVar26 != psVar18; psVar26 = psVar26 + 1) {
          pcVar19 = cmTarget::GetFileSet(this->Target,psVar26);
          anon_unknown.dwarf_1dbda9e::addFileSetEntry
                    (this,config,&dagChecker,pcVar19,&fileSetEntries);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__dnew_1);
        cVar29.End._M_current = local_240._M_current;
        cVar29.Begin._M_current = _Var25._M_current + 1;
      } while (_Var25._M_current + 1 != local_240._M_current);
    }
    cVar30 = cmTarget::GetCxxModuleHeaderSetsEntries_abi_cxx11_(this->Target);
    if (cVar30.Begin._M_current._M_current != cVar30.End._M_current._M_current) {
      do {
        local_240 = cVar30.End._M_current;
        _Var25 = cVar30.Begin._M_current;
        arg_02._M_str = ((_Var25._M_current)->Value)._M_dataplus._M_p;
        arg_02._M_len = ((_Var25._M_current)->Value)._M_string_length;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__dnew_1,arg_02,false);
        psVar18 = local_290;
        for (psVar26 = (string *)__dnew_1; psVar26 != psVar18; psVar26 = psVar26 + 1) {
          pcVar19 = cmTarget::GetFileSet(this->Target,psVar26);
          anon_unknown.dwarf_1dbda9e::addFileSetEntry
                    (this,config,&dagChecker,pcVar19,&fileSetEntries);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__dnew_1);
        cVar30.End._M_current = local_240._M_current;
        cVar30.Begin._M_current = _Var25._M_current + 1;
      } while (_Var25._M_current + 1 != local_240._M_current);
    }
    bVar12 = anon_unknown.dwarf_1dbda9e::processSources
                       (this,&fileSetEntries,__return_storage_ptr__,&uniqueSrcs,bVar12);
    if ((((bVar9) ||
         ((bVar10 &&
          (local_140 <
           (ulong)((long)(__return_storage_ptr__->
                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start))))) ||
        ((bVar11 != false &&
         (local_148 <
          (ulong)((long)(__return_storage_ptr__->
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(__return_storage_ptr__->
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start))))) ||
       ((TVar20 = False, bVar12 &&
        (local_150 <
         (ulong)((long)(__return_storage_ptr__->
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start))))) {
      TVar20 = True;
    }
    this->SourcesAreContextDependent = TVar20;
    pEVar21 = (pointer)CONCAT71(fileSetEntries.Entries.
                                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                fileSetEntries.Entries.
                                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    if (fileSetEntries.Entries.
        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != pEVar21) {
      pvVar24 = &(fileSetEntries.Entries.
                  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start)->Values;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(pvVar24);
        pbVar7 = (pointer)(((EvaluatedTargetPropertyEntry *)(pvVar24 + -1))->Backtrace).
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
        if (pbVar7 != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar7);
        }
        pbVar8 = (bool *)(pvVar24 + 1);
        pvVar24 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pvVar24[2].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
      } while ((pointer)(pbVar8 + 8) != pEVar21);
    }
    if (fileSetEntries.Entries.
        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(fileSetEntries.Entries.
                      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      CONCAT71(fileSetEntries.Entries.
                               super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               fileSetEntries.Entries.
                               super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                      (long)fileSetEntries.Entries.
                            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pEVar21 = (pointer)CONCAT71(linkInterfaceSourcesEntries.Entries.
                                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                linkInterfaceSourcesEntries.Entries.
                                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    if (linkInterfaceSourcesEntries.Entries.
        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != pEVar21) {
      pvVar24 = &(linkInterfaceSourcesEntries.Entries.
                  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start)->Values;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(pvVar24);
        pbVar7 = (pointer)(((EvaluatedTargetPropertyEntry *)(pvVar24 + -1))->Backtrace).
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
        if (pbVar7 != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar7);
        }
        pbVar8 = (bool *)(pvVar24 + 1);
        pvVar24 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pvVar24[2].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
      } while ((pointer)(pbVar8 + 8) != pEVar21);
    }
    if (linkInterfaceSourcesEntries.Entries.
        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(linkInterfaceSourcesEntries.Entries.
                      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      CONCAT71(linkInterfaceSourcesEntries.Entries.
                               super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               linkInterfaceSourcesEntries.Entries.
                               super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                      (long)linkInterfaceSourcesEntries.Entries.
                            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&uniqueSrcs._M_h);
    if (entries.Entries.
        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        entries.Entries.
        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pvVar24 = &(entries.Entries.
                  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start)->Values;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(pvVar24);
        pbVar7 = (pointer)(((EvaluatedTargetPropertyEntry *)(pvVar24 + -1))->Backtrace).
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
        if (pbVar7 != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar7);
        }
        pbVar8 = (bool *)(pvVar24 + 1);
        pvVar24 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pvVar24[2].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
      } while ((pointer)(pbVar8 + 8) !=
               entries.Entries.
               super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (entries.Entries.
        super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(entries.Entries.
                      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)entries.Entries.
                            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)entries.Entries.
                            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&dagChecker.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
      operator_delete(dagChecker.Property._M_dataplus._M_p,
                      dagChecker.Property.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&debugProperties);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetSourceFilePaths(
  std::string const& config) const
{
  std::vector<BT<std::string>> files;

  if (!this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    // At configure-time, this method can be called as part of getting the
    // LOCATION property or to export() a file to be include()d.  However
    // there is no cmGeneratorTarget at configure-time, so search the SOURCES
    // for TARGET_OBJECTS instead for backwards compatibility with OLD
    // behavior of CMP0024 and CMP0026 only.

    cmBTStringRange sourceEntries = this->Target->GetSourceEntries();
    for (auto const& entry : sourceEntries) {
      std::vector<std::string> items = cmExpandedList(entry.Value);
      for (std::string const& item : items) {
        if (cmHasLiteralPrefix(item, "$<TARGET_OBJECTS:") &&
            item.back() == '>') {
          continue;
        }
        files.emplace_back(item);
      }
    }
    return files;
  }

  std::vector<std::string> debugProperties;
  this->Makefile->GetDefExpandList("CMAKE_DEBUG_TARGET_PROPERTIES",
                                   debugProperties);

  bool debugSources =
    !this->DebugSourcesDone && cm::contains(debugProperties, "SOURCES");

  if (this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    this->DebugSourcesDone = true;
  }

  cmGeneratorExpressionDAGChecker dagChecker(this, "SOURCES", nullptr,
                                             nullptr);

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, std::string(), &dagChecker, this->SourceEntries);

  std::unordered_set<std::string> uniqueSrcs;
  bool contextDependentDirectSources =
    processSources(this, entries, files, uniqueSrcs, debugSources);

  // Collect INTERFACE_SOURCES of all direct link-dependencies.
  EvaluatedTargetPropertyEntries linkInterfaceSourcesEntries;
  AddInterfaceEntries(this, config, "INTERFACE_SOURCES", std::string(),
                      &dagChecker, linkInterfaceSourcesEntries,
                      IncludeRuntimeInterface::No, LinkInterfaceFor::Usage);
  std::vector<std::string>::size_type numFilesBefore = files.size();
  bool contextDependentInterfaceSources = processSources(
    this, linkInterfaceSourcesEntries, files, uniqueSrcs, debugSources);

  // Collect TARGET_OBJECTS of direct object link-dependencies.
  bool contextDependentObjects = false;
  std::vector<std::string>::size_type numFilesBefore2 = files.size();
  if (this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    EvaluatedTargetPropertyEntries linkObjectsEntries;
    AddObjectEntries(this, config, &dagChecker, linkObjectsEntries);
    contextDependentObjects = processSources(this, linkObjectsEntries, files,
                                             uniqueSrcs, debugSources);
  }

  // Collect this target's file sets.
  std::vector<std::string>::size_type numFilesBefore3 = files.size();
  EvaluatedTargetPropertyEntries fileSetEntries;
  AddFileSetEntries(this, config, &dagChecker, fileSetEntries);
  bool contextDependentFileSets =
    processSources(this, fileSetEntries, files, uniqueSrcs, debugSources);

  // Determine if sources are context-dependent or not.
  if (!contextDependentDirectSources &&
      !(contextDependentInterfaceSources && numFilesBefore < files.size()) &&
      !(contextDependentObjects && numFilesBefore2 < files.size()) &&
      !(contextDependentFileSets && numFilesBefore3 < files.size())) {
    this->SourcesAreContextDependent = Tribool::False;
  } else {
    this->SourcesAreContextDependent = Tribool::True;
  }

  return files;
}